

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

void av1_quantize_fp_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  int iVar1;
  qm_val_t *unaff_RBX;
  qm_val_t *unaff_R14;
  int unaff_R15D;
  _func_void_tran_low_t_ptr_intptr_t_int16_t_ptr_int16_t_ptr_int16_t_ptr_int16_t_ptr_tran_low_t_ptr_tran_low_t_ptr_int16_t_ptr_uint16_t_ptr_int16_t_ptr_int16_t_ptr
  **pp_Var2;
  undefined8 in_stack_ffffffffffffffe0;
  
  if ((int16_t *)qparam->iqmatrix == (int16_t *)0x0 ||
      (uint16_t *)qparam->qmatrix == (uint16_t *)0x0) {
    iVar1 = qparam->log_scale;
    if (iVar1 == 2) {
      pp_Var2 = &av1_quantize_fp_64x64;
    }
    else if (iVar1 == 1) {
      pp_Var2 = &av1_quantize_fp_32x32;
    }
    else {
      if (iVar1 != 0) {
        return;
      }
      pp_Var2 = &av1_quantize_fp;
    }
    (**pp_Var2)(coeff_ptr,n_coeffs,p->zbin_QTX,p->round_fp_QTX,p->quant_fp_QTX,p->quant_shift_QTX,
                qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan);
  }
  else {
    quantize_fp_helper_c
              (coeff_ptr,n_coeffs,p->round_fp_QTX,p->quant_fp_QTX,(int16_t *)qcoeff_ptr,
               (int16_t *)dqcoeff_ptr,(tran_low_t *)p->dequant_QTX,(tran_low_t *)eob_ptr,sc->scan,
               (uint16_t *)qparam->qmatrix,(int16_t *)qparam->iqmatrix,
               (int16_t *)
               CONCAT44((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),qparam->log_scale),unaff_RBX
               ,unaff_R14,unaff_R15D);
  }
  return;
}

Assistant:

void av1_quantize_fp_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                            tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                            const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  if (qm_ptr != NULL && iqm_ptr != NULL) {
    quantize_fp_helper_c(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                         p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                         dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                         sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    switch (qparam->log_scale) {
      case 0:
        av1_quantize_fp(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                        p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                        dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                        sc->iscan);
        break;
      case 1:
        av1_quantize_fp_32x32(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      case 2:
        av1_quantize_fp_64x64(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                              p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                              dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                              sc->iscan);
        break;
      default: assert(0);
    }
  }
}